

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::NodeSet::insert
          (NodeSet *this,int32_t v)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int *piVar4;
  uint32_t i;
  int32_t v_local;
  NodeSet *this_local;
  
  uVar2 = FindIndex(this,v);
  piVar4 = Vec<int>::operator[](&this->table_,uVar2);
  if (*piVar4 == v) {
    this_local._7_1_ = false;
  }
  else {
    piVar4 = Vec<int>::operator[](&this->table_,uVar2);
    if (*piVar4 == -1) {
      this->occupied_ = this->occupied_ + 1;
    }
    piVar4 = Vec<int>::operator[](&this->table_,uVar2);
    *piVar4 = v;
    uVar1 = this->occupied_;
    uVar2 = Vec<int>::size(&this->table_);
    uVar3 = Vec<int>::size(&this->table_);
    if (uVar2 - (uVar3 >> 2) <= uVar1) {
      Grow(this);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool insert(int32_t v) {
    uint32_t i = FindIndex(v);
    if (table_[i] == v) {
      return false;
    }
    if (table_[i] == kEmpty) {
      // Only inserting over an empty cell increases the number of occupied
      // slots.
      occupied_++;
    }
    table_[i] = v;
    // Double when 75% full.
    if (occupied_ >= table_.size() - table_.size()/4) Grow();
    return true;
  }